

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_block.cpp
# Opt level: O3

void * __thiscall cppnet::BlockMemoryPool::PoolLargeMalloc(BlockMemoryPool *this)

{
  void *pvVar1;
  pointer ppvVar2;
  
  ppvVar2 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppvVar2) {
    (*this->_vptr_BlockMemoryPool[7])(this,0);
    ppvVar2 = (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  pvVar1 = ppvVar2[-1];
  (this->_free_mem_vec).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppvVar2 + -1;
  return pvVar1;
}

Assistant:

void* BlockMemoryPool::PoolLargeMalloc() {
#ifdef __use_iocp__
    std::lock_guard<std::mutex> lock(_mutex);
#endif
    if (_free_mem_vec.empty()) {
        Expansion();
    }

    void* ret = _free_mem_vec.back();
    _free_mem_vec.pop_back();
    return ret;
}